

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

bool __thiscall wallet::SQLiteBatch::TxnCommit(SQLiteBatch *this)

{
  SQliteExecHandler *pSVar1;
  SQLiteDatabase *pSVar2;
  bool bVar3;
  int iVar4;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *puVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  long *plVar6;
  char *in_stack_ffffffffffffffb0;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_database->m_db != (sqlite3 *)0x0) && (this->m_txn == true)) {
    sqlite3_get_autocommit();
    inline_assertion_check<true,bool>
              ((bool *)&stack0xffffffffffffffa8,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
               ,0x29d,"TxnCommit","m_database.HasActiveTxn()");
    puVar5 = inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
                       (&this->m_exec_handler,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                        ,0x29e,"TxnCommit","m_exec_handler");
    pSVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
             .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl;
    pSVar2 = this->m_database;
    plVar6 = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffa8,"COMMIT TRANSACTION","");
    iVar4 = (*pSVar1->_vptr_SQliteExecHandler[2])(pSVar1,pSVar2,&stack0xffffffffffffffa8);
    if (plVar6 != local_48) {
      operator_delete(plVar6,local_48[0] + 1);
    }
    if (iVar4 == 0) {
      this->m_txn = false;
      CSemaphore::post(&this->m_database->m_write_semaphore);
      bVar3 = true;
      goto LAB_001c8994;
    }
    logging_function._M_str = "TxnCommit";
    logging_function._M_len = 9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x5a;
    LogPrintf_<>(logging_function,source_file,0x2a0,
                 I2P|QT|LIBEVENT|PROXY|ADDRMAN|ESTIMATEFEE|WALLETDB|HTTP,(Level)plVar6,
                 in_stack_ffffffffffffffb0);
  }
  bVar3 = false;
LAB_001c8994:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::TxnCommit()
{
    if (!m_database.m_db || !m_txn) return false;
    Assert(m_database.HasActiveTxn());
    int res = Assert(m_exec_handler)->Exec(m_database, "COMMIT TRANSACTION");
    if (res != SQLITE_OK) {
        LogPrintf("SQLiteBatch: Failed to commit the transaction\n");
    } else {
        m_txn = false;
        m_database.m_write_semaphore.post();
    }
    return res == SQLITE_OK;
}